

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButton::click(QAbstractButton *this)

{
  long lVar1;
  bool bVar2;
  QAbstractButtonPrivate *this_00;
  QPointer<QAbstractButton> *in_RDI;
  long in_FS_OFFSET;
  QAbstractButtonPrivate *d;
  QPointer<QAbstractButton> guard;
  QAbstractButton *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QWidget::isEnabled((QWidget *)0x4fedfa);
  if (bVar2) {
    this_00 = d_func((QAbstractButton *)0x4fee0d);
    QPointer<QAbstractButton>::QPointer<void>(in_RDI,in_stack_ffffffffffffffc8);
    this_00->field_0x28c = this_00->field_0x28c & 0xef | 0x10;
    QAbstractButtonPrivate::emitPressed(this_00);
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x4fee64);
    if (bVar2) {
      this_00->field_0x28c = this_00->field_0x28c & 0xef;
      (**(code **)((in_RDI->wp).d + 0x1b0))();
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x4fee99);
      if (bVar2) {
        QAbstractButtonPrivate::emitReleased(this_00);
      }
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x4feeb3);
      if (bVar2) {
        QAbstractButtonPrivate::emitClicked(this_00);
      }
    }
    QPointer<QAbstractButton>::~QPointer((QPointer<QAbstractButton> *)0x4feecf);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButton::click()
{
    if (!isEnabled())
        return;
    Q_D(QAbstractButton);
    QPointer<QAbstractButton> guard(this);
    d->down = true;
    d->emitPressed();
    if (guard) {
        d->down = false;
        nextCheckState();
        if (guard)
            d->emitReleased();
        if (guard)
            d->emitClicked();
    }
}